

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Performance::anon_unknown_0::RenderCountCase::calibrate(RenderCountCase *this)

{
  TestLog *log;
  int iVar1;
  State SVar2;
  int iVar3;
  undefined4 extraout_var;
  deUint64 dVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  deUint64 dVar6;
  long lVar7;
  deUint8 buffer [4];
  TheilSenCalibrator calibrator;
  RenderData occludedGeometry;
  RenderData occluderGeometry;
  CalibratorParameters local_344;
  ObjectData local_328;
  undefined1 local_240 [152];
  deUint32 local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  ObjectWrapper local_170;
  ObjectWrapper local_158;
  int local_140;
  RenderData local_138;
  long lVar4;
  
  iVar1 = (*((this->super_BaseCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  log = ((this->super_BaseCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  (*(this->super_BaseCase).super_TestCase.super_TestNode._vptr_TestNode[7])
            ((ObjectData *)local_240,this);
  RenderData::RenderData(&local_138,(ObjectData *)local_240,(this->super_BaseCase).m_renderCtx,log);
  if (local_170.m_gl != (Functions *)0x0) {
    operator_delete(local_170.m_gl,
                    CONCAT44(local_170._20_4_,local_170.m_object) - (long)local_170.m_gl);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_190);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             (local_240 + 0x90));
  lVar7 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_240 + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  (*(this->super_BaseCase).super_TestCase.super_TestNode._vptr_TestNode[8])(&local_328,this);
  RenderData::RenderData((RenderData *)local_240,&local_328,(this->super_BaseCase).m_renderCtx,log);
  if (local_328.geometry.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.geometry.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_328.geometry.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.geometry.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_328.shader.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_328.shader.attribLocationBindings);
  lVar7 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_328.shader.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  local_344.numInitialCalls = 0x14;
  local_344.maxCalibrateIterationFrames = 10;
  local_344.calibrateIterationShortcutThreshold = 20000.0;
  local_344.maxCalibrateIterations = 0x14;
  local_344.targetFrameTimeUs = 33000.0;
  local_344.frameTimeCapUs = 40000.0;
  local_344.targetMeasureDurationUs = 1e+06;
  deqp::gls::TheilSenCalibrator::TheilSenCalibrator((TheilSenCalibrator *)&local_328,&local_344);
  while( true ) {
    while( true ) {
      SVar2 = deqp::gls::TheilSenCalibrator::getState((TheilSenCalibrator *)&local_328);
      if (SVar2 != STATE_RECOMPUTE_PARAMS) break;
      deqp::gls::TheilSenCalibrator::recomputeParameters((TheilSenCalibrator *)&local_328);
    }
    if (SVar2 != STATE_MEASURE) break;
    dVar5 = deGetMicroseconds();
    (**(code **)(lVar4 + 0x188))(0x4500);
    (**(code **)(lVar4 + 0x4e8))(0xb71);
    iVar1 = (*((this->super_BaseCase).m_renderCtx)->_vptr_RenderContext[3])();
    lVar7 = CONCAT44(extraout_var_00,iVar1);
    (**(code **)(lVar7 + 0x1680))(local_138.m_program.m_program.m_program);
    (**(code **)(lVar7 + 0xd8))(local_138.m_vao.super_ObjectWrapper.m_object);
    (**(code **)(lVar7 + 0x538))(4,0,local_138.m_numVertices);
    (**(code **)(lVar7 + 0xd8))(0);
    iVar1 = (int)local_328.shader.sources[1].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar3 = (*((this->super_BaseCase).m_renderCtx)->_vptr_RenderContext[3])();
    lVar7 = CONCAT44(extraout_var_01,iVar3);
    (**(code **)(lVar7 + 0x1680))(local_1a8);
    (**(code **)(lVar7 + 0xd8))(local_170.m_object);
    (**(code **)(lVar7 + 0x548))(4,0,local_140,iVar1);
    (**(code **)(lVar7 + 0xd8))(0);
    (**(code **)(lVar4 + 0x1220))(0,0,1,1,0x1908,0x1401,&local_344);
    dVar6 = deGetMicroseconds();
    deqp::gls::TheilSenCalibrator::recordIteration((TheilSenCalibrator *)&local_328,dVar6 - dVar5);
  }
  if (SVar2 == STATE_FINISHED) {
    deqp::gls::logCalibrationInfo
              (((this->super_BaseCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
               (TheilSenCalibrator *)&local_328);
  }
  else {
    local_328.shader.sources[1].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  deqp::gls::TheilSenCalibrator::~TheilSenCalibrator((TheilSenCalibrator *)&local_328);
  glu::ObjectWrapper::~ObjectWrapper(&local_158);
  glu::ObjectWrapper::~ObjectWrapper(&local_170);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_240);
  glu::ObjectWrapper::~ObjectWrapper(&local_138.m_vbo.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&local_138.m_vao.super_ObjectWrapper);
  glu::ShaderProgram::~ShaderProgram(&local_138.m_program);
  return (int)local_328.shader.sources[1].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
}

Assistant:

int RenderCountCase::calibrate (void) const
{
	using namespace gls;

	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();

	const RenderData		occluderGeometry	(genOccluderGeometry(), m_renderCtx, log);
	const RenderData		occludedGeometry	(genOccludedGeometry(), m_renderCtx, log);

	TheilSenCalibrator		calibrator			(CalibratorParameters(20, // Initial workload
																	  10, // Max iteration frames
																	  20.0f, // Iteration shortcut threshold ms
																	  20, // Max iterations
																	  33.0f, // Target frame time
																	  40.0f, // Frame time cap
																	  1000.0f // Target measurement duration
																	  ));

	while (true)
	{
		switch(calibrator.getState())
		{
			case TheilSenCalibrator::STATE_FINISHED:
				logCalibrationInfo(m_testCtx.getLog(), calibrator);
				return calibrator.getCallCount();

			case TheilSenCalibrator::STATE_MEASURE:
			{
				deUint8	buffer[4];
				deInt64 now;
				deInt64 prev;

				prev = deGetMicroseconds();

				gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
				gl.disable(GL_DEPTH_TEST);

				render(occluderGeometry);
				render(occludedGeometry, calibrator.getCallCount());

				gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

				now = deGetMicroseconds();

				calibrator.recordIteration(now - prev);
				break;
			}

			case TheilSenCalibrator::STATE_RECOMPUTE_PARAMS:
				calibrator.recomputeParameters();
				break;
			default:
				DE_ASSERT(false);
				return 1;
		}
	}
}